

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O2

void __thiscall trento::WoodsSaxonNucleus::sample_nucleons_impl(WoodsSaxonNucleus *this)

{
  bool bVar1;
  int iVar2;
  double *r;
  pointer pdVar3;
  const_iterator nucleon;
  pointer pdVar4;
  result_type_conflict rVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  allocator_type local_69;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  vector<double,_std::allocator<double>_> radii;
  
  std::vector<double,_std::allocator<double>_>::vector
            (&radii,((long)(this->super_MinDistNucleus).super_Nucleus.nucleons_.
                           super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->super_MinDistNucleus).super_Nucleus.nucleons_.
                          super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x38,&local_69);
  pdVar4 = radii.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  for (pdVar3 = radii.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar3 != pdVar4; pdVar3 = pdVar3 + 1) {
    rVar5 = std::piecewise_linear_distribution<double>::operator()
                      (&this->woods_saxon_dist_,
                       (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                        *)random::engine);
    *pdVar3 = rVar5;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (radii.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             radii.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
  nucleon._M_current =
       (this->super_MinDistNucleus).super_Nucleus.nucleons_.
       super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
       super__Vector_impl_data._M_start;
  pdVar4 = radii.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
           ._M_start;
  do {
    if (nucleon._M_current ==
        (this->super_MinDistNucleus).super_Nucleus.nucleons_.
        super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&radii.super__Vector_base<double,_std::allocator<double>_>);
      return;
    }
    iVar2 = 1000;
    do {
      local_58 = random::cos_theta<double>();
      local_60 = random::phi<double>();
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_58;
      local_68 = *pdVar4;
      auVar8 = vfnmadd213sd_fma(auVar8,auVar8,ZEXT816(0x3ff0000000000000));
      if (auVar8._0_8_ < 0.0) {
        dVar6 = sqrt(auVar8._0_8_);
      }
      else {
        auVar8 = vsqrtsd_avx(auVar8,auVar8);
        dVar6 = auVar8._0_8_;
      }
      local_68 = local_68 * dVar6;
      local_50 = cos(local_60);
      local_50 = local_50 * local_68;
      dVar7 = sin(local_60);
      dVar6 = *pdVar4;
      (nucleon._M_current)->x_ = local_50 + (this->super_MinDistNucleus).super_Nucleus.offset_;
      (nucleon._M_current)->y_ = dVar7 * local_68;
      (nucleon._M_current)->z_ = local_58 * dVar6;
      (nucleon._M_current)->is_participant_ = false;
      (nucleon._M_current)->constituents_exist_ = false;
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) break;
      bVar1 = MinDistNucleus::is_too_close(&this->super_MinDistNucleus,nucleon);
    } while (bVar1);
    nucleon._M_current = nucleon._M_current + 1;
    pdVar4 = pdVar4 + 1;
  } while( true );
}

Assistant:

void WoodsSaxonNucleus::sample_nucleons_impl() {
  // When placing nucleons with a minimum distance criterion, resample spherical
  // angles until the nucleon is not too close to a previously sampled nucleon,
  // but do not resample radius -- this could modify the Woods-Saxon dist.

  // Because of the r^2 Jacobian, there is less available space at smaller
  // radii.  Therefore, pre-sample all radii first, sort them, and then place
  // nucleons starting with the smallest radius and working outwards.  This
  // dramatically reduces the chance that a nucleon cannot be placed.
  std::vector<double> radii(size());
  for (auto&& r : radii)
    r = woods_saxon_dist_(random::engine);
  std::sort(radii.begin(), radii.end());

  // Place each nucleon at a pre-sampled radius.
  auto r_iter = radii.cbegin();
  for (iterator nucleon = begin(); nucleon != end(); ++nucleon) {
    // Get radius and advance iterator.
    auto& r = *r_iter++;

    // Sample angles until the minimum distance criterion is satisfied.
    auto ntries = 0;
    do {
      // Sample isotropic spherical angles.
      auto cos_theta = random::cos_theta<double>();
      auto phi = random::phi<double>();

      // Convert to Cartesian coordinates.
      auto r_sin_theta = r * std::sqrt(1. - cos_theta*cos_theta);
      auto x = r_sin_theta * std::cos(phi);
      auto y = r_sin_theta * std::sin(phi);
      auto z = r * cos_theta;

      set_nucleon_position(*nucleon, x, y, z);

      // Retry sampling a reasonable number of times.  If a nucleon cannot be
      // placed, give up and leave it at its last sampled position.  Some
      // approximate numbers for Pb nuclei:
      //
      //   dmin = 0.5 fm, < 0.001% of nucleons cannot be placed
      //          1.0 fm, ~0.005%
      //          1.5 fm, ~0.1%
      //          1.73 fm, ~1%
    } while (++ntries < 1000 && is_too_close(nucleon));
  }
  // XXX: re-center nucleon positions?
}